

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateEnterExecutingMode(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    helics::Federate::enterExecutingMode(this,NO_ITERATIONS);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingMode(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        // printf("current state=%d\n", static_cast<int>(fedObj->getCurrentState()));
        fedObj->enterExecutingMode();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}